

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_bfffo_32_aw(void)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint local_24;
  uint local_20;
  uint ea;
  uint bit;
  uint data;
  uint width;
  sint local_offset;
  sint offset;
  uint word2;
  
  if ((m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
  }
  else {
    uVar2 = m68ki_read_imm_16();
    width = uVar2 >> 6 & 0x1f;
    uVar3 = m68ki_read_imm_16();
    if ((uVar2 & 0x800) != 0) {
      width = m68ki_cpu.dar[(int)(uVar2 >> 6 & 7)];
    }
    bit = uVar2;
    if ((uVar2 & 0x20) != 0) {
      bit = m68ki_cpu.dar[uVar2 & 7];
    }
    local_24 = (int)width / 8 + (int)(short)uVar3;
    data = (int)width % 8;
    if ((int)data < 0) {
      data = data + 8;
      local_24 = local_24 - 1;
    }
    iVar4 = (bit - 1 & 0x1f) + 1;
    uVar3 = m68ki_read_32_fc(local_24,m68ki_cpu.s_flag | m68ki_address_space);
    ea = uVar3 << ((byte)data & 0x1f);
    if (0x20 < data + iVar4) {
      uVar3 = m68ki_read_8_fc(local_24 + 4,m68ki_cpu.s_flag | m68ki_address_space);
      ea = (uVar3 << ((byte)data & 0x1f)) >> 8 | ea;
    }
    m68ki_cpu.n_flag = ea >> 0x18;
    cVar1 = (char)iVar4;
    m68ki_cpu.not_z_flag = ea >> (0x20U - cVar1 & 0x1f);
    m68ki_cpu.v_flag = 0;
    m68ki_cpu.c_flag = 0;
    for (local_20 = 1 << (cVar1 - 1U & 0x1f);
        local_20 != 0 && (m68ki_cpu.not_z_flag & local_20) == 0; local_20 = local_20 >> 1) {
      width = width + 1;
    }
    m68ki_cpu.dar[uVar2 >> 0xc & 7] = width;
  }
  return;
}

Assistant:

static void m68k_op_bfffo_32_aw(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		sint offset = (word2>>6)&31;
		sint local_offset;
		uint width = word2;
		uint data;
		uint bit;
		uint ea = EA_AW_8();


		if(BIT_B(word2))
			offset = MAKE_INT_32(REG_D[offset&7]);
		if(BIT_5(word2))
			width = REG_D[width&7];

		/* Offset is signed so we have to use ugly math =( */
		ea += offset / 8;
		local_offset = offset % 8;
		if(local_offset < 0)
		{
			local_offset += 8;
			ea--;
		}
		width = ((width-1) & 31) + 1;

		data = m68ki_read_32(ea);
		data = MASK_OUT_ABOVE_32(data<<local_offset);

		if((local_offset+width) > 32)
			data |= (m68ki_read_8(ea+4) << local_offset) >> 8;

		FLAG_N = NFLAG_32(data);
		data  >>= (32 - width);

		FLAG_Z = data;
		FLAG_V = VFLAG_CLEAR;
		FLAG_C = CFLAG_CLEAR;

		for(bit = 1<<(width-1);bit && !(data & bit);bit>>= 1)
			offset++;

		REG_D[(word2>>12)&7] = offset;

		return;
	}
	m68ki_exception_illegal();
}